

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

Promise<int> __thiscall kj::UnixEventPort::onChildExit(UnixEventPort *this,Maybe<int> *pid)

{
  NullableValue<int> params;
  Maybe<int> *in_RDX;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  
  _kjCondition.value = (bool *)&(anonymous_namespace)::capturedChildExit;
  if ((anonymous_namespace)::capturedChildExit == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&,char_const(&)[66]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x121,FAILED,"capturedChildExit",
               "_kjCondition,\"must call UnixEventPort::captureChildExit() to use onChildExit().\"",
               &_kjCondition,
               (char (*) [66])"must call UnixEventPort::captureChildExit() to use onChildExit().");
    kj::_::Debug::Fault::fatal(&f);
  }
  params = pid[0x1e].ptr;
  if (params == (NullableValue<int>)0x0) {
    f.exception._0_1_ = (anonymous_namespace)::threadClaimedChildExits ^ 1;
    if ((byte)f.exception == 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[62]>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                 ,0x12a,FAILED,"!threadClaimedChildExits",
                 "_kjCondition,\"only one UnixEvertPort per process may listen for child exits\"",
                 (DebugExpression<bool> *)&f,
                 (char (*) [62])"only one UnixEvertPort per process may listen for child exits");
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    (anonymous_namespace)::threadClaimedChildExits = 1;
    params = (NullableValue<int>)operator_new(0x30);
    *(undefined8 *)((long)params + 0x10) = 0;
    *(undefined8 *)((long)params + 0x18) = 0;
    *(undefined8 *)params = 0;
    *(undefined8 *)((long)params + 8) = 0;
    *(undefined8 **)((long)params + 0x18) = (undefined8 *)((long)params + 8);
    *(undefined8 **)((long)params + 0x20) = (undefined8 *)((long)params + 8);
    *(undefined8 *)((long)params + 0x28) = 0;
    pid[0x1d].ptr = (NullableValue<int>)&kj::_::HeapDisposer<kj::UnixEventPort::ChildSet>::instance;
    pid[0x1e].ptr = params;
  }
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<int,kj::UnixEventPort::ChildExitPromiseAdapter>,kj::_::PromiseDisposer,kj::UnixEventPort::ChildSet&,kj::Maybe<int>&>
            ((PromiseDisposer *)this,(ChildSet *)params,in_RDX);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<int> UnixEventPort::onChildExit(Maybe<pid_t>& pid) {
  KJ_REQUIRE(capturedChildExit,
      "must call UnixEventPort::captureChildExit() to use onChildExit().");

  ChildSet* cs;
  KJ_IF_SOME(c, childSet) {
    cs = c;
  } else {
    // In theory we should do an atomic compare-and-swap on threadClaimedChildExits, but this is
    // for debug purposes only so it's not a big deal.
    KJ_REQUIRE(!threadClaimedChildExits,
        "only one UnixEvertPort per process may listen for child exits");
    threadClaimedChildExits = true;

    auto newChildSet = kj::heap<ChildSet>();
    cs = newChildSet;
    childSet = kj::mv(newChildSet);
  }